

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_hud.cpp
# Opt level: O2

void DrawStatus(player_t *CPlayer,int x,int y)

{
  char *pcVar1;
  int *piVar2;
  int y_local;
  char tempstr [50];
  
  y_local = x;
  if (hud_showscore.Value) {
    pcVar1 = (char *)(ulong)(uint)(CPlayer->mo->super_AActor).Score;
    mysnprintf(tempstr,0x32,"%i ");
    DrawStatLine((int)&y_local,(int *)"Sc:",tempstr,pcVar1);
  }
  if (hud_showstats.Value == true) {
    pcVar1 = (char *)(ulong)(uint)(CPlayer->mo->super_AActor).accuracy;
    mysnprintf(tempstr,0x32,"%i ");
    DrawStatLine((int)&y_local,(int *)"Ac:",tempstr,pcVar1);
    pcVar1 = (char *)(ulong)(uint)(CPlayer->mo->super_AActor).stamina;
    mysnprintf(tempstr,0x32,"%i ");
    DrawStatLine((int)&y_local,(int *)"St:",tempstr,pcVar1);
  }
  if (deathmatch.Value == 0) {
    if (hud_showsecrets.Value == true) {
      piVar2 = &level.found_secrets;
      if (multiplayer != false) {
        piVar2 = &CPlayer->secretcount;
      }
      pcVar1 = (char *)(ulong)(uint)*piVar2;
      mysnprintf(tempstr,0x32,"%i/%i ",pcVar1,(ulong)(uint)level.total_secrets);
      DrawStatLine((int)&y_local,(int *)"S:",tempstr,pcVar1);
    }
    if (hud_showitems.Value == true) {
      piVar2 = &level.found_items;
      if (multiplayer != false) {
        piVar2 = &CPlayer->itemcount;
      }
      pcVar1 = (char *)(ulong)(uint)*piVar2;
      mysnprintf(tempstr,0x32,"%i/%i ",pcVar1,(ulong)(uint)level.total_items);
      DrawStatLine((int)&y_local,(int *)"I:",tempstr,pcVar1);
    }
    if (hud_showmonsters.Value == true) {
      piVar2 = &level.killed_monsters;
      if (multiplayer != false) {
        piVar2 = &CPlayer->killcount;
      }
      pcVar1 = (char *)(ulong)(uint)*piVar2;
      mysnprintf(tempstr,0x32,"%i/%i ",pcVar1,(ulong)(uint)level.total_monsters);
      DrawStatLine((int)&y_local,(int *)"K:",tempstr,pcVar1);
    }
  }
  return;
}

Assistant:

static void DrawStatus(player_t * CPlayer, int x, int y)
{
	char tempstr[50];
	
	if (hud_showscore)
	{
		mysnprintf(tempstr, countof(tempstr), "%i ", CPlayer->mo->Score);
		DrawStatLine(x, y, "Sc:", tempstr);
	}
	
	if (hud_showstats)
	{
		mysnprintf(tempstr, countof(tempstr), "%i ", CPlayer->mo->accuracy);
		DrawStatLine(x, y, "Ac:", tempstr);
		mysnprintf(tempstr, countof(tempstr), "%i ", CPlayer->mo->stamina);
		DrawStatLine(x, y, "St:", tempstr);
	}
	
	if (!deathmatch)
	{
		// FIXME: ZDoom doesn't preserve the player's stat counters across hubs so this doesn't
		// work in cooperative hub games
		if (hud_showsecrets)
		{
			mysnprintf(tempstr, countof(tempstr), "%i/%i ", multiplayer? CPlayer->secretcount : level.found_secrets, level.total_secrets);
			DrawStatLine(x, y, "S:", tempstr);
		}
		
		if (hud_showitems)
		{
			mysnprintf(tempstr, countof(tempstr), "%i/%i ", multiplayer? CPlayer->itemcount : level.found_items, level.total_items);
			DrawStatLine(x, y, "I:", tempstr);
		}
		
		if (hud_showmonsters)
		{
			mysnprintf(tempstr, countof(tempstr), "%i/%i ", multiplayer? CPlayer->killcount : level.killed_monsters, level.total_monsters);
			DrawStatLine(x, y, "K:", tempstr);
		}
	}
}